

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  double duration;
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  SectionStats *this_00;
  SectionInfo *__p;
  bool bVar4;
  Colour colour;
  string local_40;
  
  this_00 = _sectionStats;
  TablePrinter::close((this->m_tablePrinter)._M_t.
                      super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                      .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,
                      (int)_sectionStats);
  if (_sectionStats->missingAssertions == true) {
    TablePrinter::close((this->m_tablePrinter)._M_t.
                        super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                        .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,
                        (int)this_00);
    lazyPrintWithoutClosingBenchmarkTable(this);
    local_40._M_dataplus._M_p._0_1_ = 0;
    Colour::use(BrightRed);
    bVar4 = (ulong)(((long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                           m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                           m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333) <
            2;
    pcVar3 = "\nNo assertions in test case";
    if (!bVar4) {
      pcVar3 = "\nNo assertions in section";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,pcVar3,
               (ulong)bVar4 * 2 + 0x19);
    poVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," \'",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(_sectionStats->sectionInfo).name._M_dataplus._M_p,
                        (_sectionStats->sectionInfo).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    this_00 = (SectionStats *)(ulong)(uint)(int)cVar1;
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    Colour::use(None);
  }
  duration = _sectionStats->durationInSeconds;
  bVar4 = shouldShowDuration((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
                             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,duration);
  if (bVar4) {
    poVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    getFormattedDuration_abi_cxx11_(&local_40,(Catch *)this_00,duration);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                local_40._M_dataplus._M_p._0_1_),
                        local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," s: ",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(_sectionStats->sectionInfo).name._M_dataplus._M_p,
                        (_sectionStats->sectionInfo).name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
  }
  if (this->m_headerPrinted == true) {
    this->m_headerPrinted = false;
  }
  __p = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
        super__Vector_impl_data._M_finish + -1;
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = __p;
  __gnu_cxx::new_allocator<Catch::SectionInfo>::destroy<Catch::SectionInfo>
            ((new_allocator<Catch::SectionInfo> *)
             &(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack,__p);
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        Colour colour(Colour::ResultError);
        if (m_sectionStack.size() > 1)
            stream << "\nNo assertions in section";
        else
            stream << "\nNo assertions in test case";
        stream << " '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << std::endl;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}